

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O3

void __thiscall GF2::VFunc<7UL,_8UL>::VFunc(VFunc<7UL,_8UL> *this,word valRight)

{
  uint uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  
  lVar2 = 0;
  memset(this,0,0x400);
  uVar1 = (uint)valRight & 0xff;
  auVar3._4_4_ = 0;
  auVar3._0_4_ = uVar1;
  auVar3._8_4_ = uVar1;
  auVar3._12_4_ = 0;
  do {
    *(undefined1 (*) [16])((this->super_Func<7UL,_GF2::WW<8UL>_>)._vals + lVar2) = auVar3;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x80);
  return;
}

Assistant:

VFunc(word valRight = 0) : Func<_n, Image>(WW<_m>(valRight)) {}